

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  StkId pTVar1;
  Value *pVVar2;
  StkId pTVar3;
  TValue *io1_4;
  TValue *io2_4;
  TValue *io1_3;
  TValue *io2_3;
  TValue *io1_2;
  TValue *io2_2;
  TValue *io1_1;
  TValue *io2_1;
  TValue *io1;
  TValue *io2;
  ptrdiff_t result;
  int hasres_local;
  TValue *p3_local;
  TValue *p2_local;
  TValue *p1_local;
  TValue *f_local;
  lua_State *L_local;
  
  pTVar1 = L->stack;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  pTVar3->value_ = f->value_;
  pTVar3->tt_ = f->tt_;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  pTVar3->value_ = p1->value_;
  pTVar3->tt_ = p1->tt_;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  pTVar3->value_ = p2->value_;
  pTVar3->tt_ = p2->tt_;
  if (hasres == 0) {
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->value_ = p3->value_;
    pTVar3->tt_ = p3->tt_;
  }
  luaD_call(L,L->top + -(long)(4 - hasres),hasres,L->ci->callstatus & 1);
  if (hasres != 0) {
    pVVar2 = (Value *)((long)L->stack + ((long)p3 - (long)pTVar1));
    pTVar1 = L->top;
    pTVar3 = pTVar1 + -1;
    L->top = pTVar3;
    *pVVar2 = pTVar3->value_;
    pVVar2[1].b = pTVar1[-1].tt_;
  }
  return;
}

Assistant:

static void callTM (lua_State *L, const TValue *f, const TValue *p1,
                    const TValue *p2, TValue *p3, int hasres) {
  ptrdiff_t result = savestack(L, p3);
  setobj2s(L, L->top++, f);  /* push function */
  setobj2s(L, L->top++, p1);  /* 1st argument */
  setobj2s(L, L->top++, p2);  /* 2nd argument */
  if (!hasres)  /* no result? 'p3' is third argument */
    setobj2s(L, L->top++, p3);  /* 3rd argument */
  /* metamethod may yield only when called from Lua code */
  luaD_call(L, L->top - (4 - hasres), hasres, isLua(L->ci));
  if (hasres) {  /* if has result, move it to its place */
    p3 = restorestack(L, result);
    setobjs2s(L, p3, --L->top);
  }
}